

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void Am_Stop_Timer(Am_Object *obj,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *this;
  Am_Interactor_Time_Event *this_00;
  Am_Interactor_Time_Event *e;
  Am_Slot_Key slot_local;
  Am_Object *obj_local;
  
  Am_Value_List::Start(&am_timing_events);
  while( true ) {
    bVar1 = Am_Value_List::Last(&am_timing_events);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    this = Am_Value_List::Get(&am_timing_events);
    this_00 = (Am_Interactor_Time_Event *)Am_Value::operator_cast_to_void_(this);
    bVar1 = Am_Object::operator==((Am_Object *)this_00,obj);
    if ((bVar1) && (this_00->method_slot == slot)) break;
    Am_Value_List::Next(&am_timing_events);
  }
  Am_Value_List::Delete(&am_timing_events,true);
  if (this_00 == (Am_Interactor_Time_Event *)0x0) {
    return;
  }
  Am_Interactor_Time_Event::~Am_Interactor_Time_Event(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void
Am_Stop_Timer(Am_Object obj, Am_Slot_Key slot)
{
  Am_Interactor_Time_Event *e;
  for (am_timing_events.Start(); !am_timing_events.Last();
       am_timing_events.Next()) {
    e = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
    if (e->object == obj && e->method_slot == slot) {
      am_timing_events.Delete();
      delete e;
      return;
    }
  }
  //Am_ERROR("Am_Stop_Timer on " << obj << " slot " << slot
  //     << " but hasn't been registered")
}